

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O1

int SSL_set_handshake_hints(SSL *ssl,uint8_t *hints,size_t hints_len)

{
  void *__src;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> _Var1;
  uint8_t *puVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  int line;
  Array<unsigned_char> *pAVar6;
  ptrdiff_t _Num;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj;
  uint64_t group_id;
  CBS secret;
  CBS ciphertext;
  CBS seq;
  int has_ticket;
  int has_psk;
  int has_ecdhe;
  int has_server_random_tls12;
  int has_cert_compression;
  int has_signature_hint;
  int has_key_share;
  int has_server_random_tls13;
  uint64_t sig_alg;
  CBS signature_hint;
  CBS ecdhe;
  CBS cert_compression;
  CBS key_share;
  CBS ticket;
  CBS server_random_tls12;
  CBS psk;
  CBS server_random_tls13;
  CBS cbs;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> local_130;
  CBS local_128;
  CBS local_118;
  CBS local_108;
  CBS local_f8;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  uint16_t local_c8;
  undefined6 uStack_c6;
  CBS local_c0;
  CBS local_b0;
  CBS local_a0;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  iVar5 = SSL_is_dtls(ssl);
  if (iVar5 != 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x405);
    return 0;
  }
  local_130._M_head_impl = (SSL_HANDSHAKE_HINTS *)OPENSSL_malloc(0xf8);
  iVar5 = 0;
  if (local_130._M_head_impl == (pointer)0x0) {
    local_130._M_head_impl = (pointer)0x0;
  }
  else {
    memset(local_130._M_head_impl,0,0xf8);
  }
  if (local_130._M_head_impl == (pointer)0x0) goto LAB_0013ff0e;
  local_40.data = hints;
  local_40.len = hints_len;
  iVar5 = CBS_get_asn1(&local_40,&local_f8,0x20000010);
  line = 0x427;
  if ((((((iVar5 != 0) &&
         (iVar5 = CBS_get_optional_asn1(&local_f8,&local_50,&local_cc,0x80000000), iVar5 != 0)) &&
        (iVar5 = CBS_get_optional_asn1(&local_f8,&local_90,&local_d0,0xa0000001), iVar5 != 0)) &&
       ((iVar5 = CBS_get_optional_asn1(&local_f8,&local_c0,&local_d4,0xa0000002), iVar5 != 0 &&
        (iVar5 = CBS_get_optional_asn1(&local_f8,&local_60,&local_e4,0x80000003), iVar5 != 0)))) &&
      (bVar4 = get_optional_implicit_null
                         (&local_f8,&(local_130._M_head_impl)->ignore_psk,0x80000004), bVar4)) &&
     (((iVar5 = CBS_get_optional_asn1(&local_f8,&local_a0,&local_d8,0x80000005), iVar5 != 0 &&
       (iVar5 = CBS_get_optional_asn1(&local_f8,&local_70,&local_dc,0x80000006), iVar5 != 0)) &&
      ((iVar5 = CBS_get_optional_asn1(&local_f8,&local_b0,&local_e0,0x20000007), iVar5 != 0 &&
       (((iVar5 = CBS_get_optional_asn1(&local_f8,&local_80,&local_e8,0x80000008), iVar5 != 0 &&
         (bVar4 = get_optional_implicit_null
                            (&local_f8,&(local_130._M_head_impl)->renew_ticket,0x80000009), bVar4))
        && (bVar4 = get_optional_implicit_null
                              (&local_f8,&(local_130._M_head_impl)->ignore_ticket,0x8000000a), bVar4
           )))))))) {
    if (local_cc != 0) {
      pAVar6 = &(local_130._M_head_impl)->server_random_tls13;
      bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_50.len);
      if (bVar4 && local_50.len != 0) {
        memmove(pAVar6->data_,local_50.data,local_50.len);
      }
      if (bVar4) goto LAB_0013fbf2;
LAB_001402b9:
      iVar5 = 0;
      goto LAB_0013ff0e;
    }
LAB_0013fbf2:
    if (local_d0 != 0) {
      iVar5 = CBS_get_asn1_uint64(&local_90,(uint64_t *)&local_128);
      if (((iVar5 != 0) &&
          (0xffffffffffff0000 < CONCAT62(local_128.data._2_6_,(uint16_t)local_128.data) - 0x10000U))
         && (iVar5 = CBS_get_asn1(&local_90,&local_108,4), sVar3 = local_108.len,
            puVar2 = local_108.data, iVar5 != 0)) {
        pAVar6 = &(local_130._M_head_impl)->key_share_ciphertext;
        bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_108.len);
        if (bVar4 && sVar3 != 0) {
          memmove(pAVar6->data_,puVar2,sVar3);
        }
        if ((bVar4) &&
           (iVar5 = CBS_get_asn1(&local_90,&local_118,4), sVar3 = local_118.len,
           puVar2 = local_118.data, iVar5 != 0)) {
          pAVar6 = &(local_130._M_head_impl)->key_share_secret;
          bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_118.len);
          if (bVar4 && sVar3 != 0) {
            memmove(pAVar6->data_,puVar2,sVar3);
          }
          if (bVar4) {
            (local_130._M_head_impl)->key_share_group_id = (uint16_t)local_128.data;
            goto LAB_0013fd09;
          }
        }
      }
      iVar5 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x439);
      goto LAB_0013ff0e;
    }
LAB_0013fd09:
    if (local_d4 != 0) {
      iVar5 = CBS_get_asn1_uint64(&local_c0,(uint64_t *)&local_c8);
      if (((iVar5 != 0) && (0xffffffffffff0000 < CONCAT62(uStack_c6,local_c8) - 0x10000U)) &&
         (iVar5 = CBS_get_asn1(&local_c0,&local_108,4), sVar3 = local_108.len,
         puVar2 = local_108.data, iVar5 != 0)) {
        pAVar6 = &(local_130._M_head_impl)->signature_input;
        bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_108.len);
        if (bVar4 && sVar3 != 0) {
          memmove(pAVar6->data_,puVar2,sVar3);
        }
        if ((bVar4) &&
           (iVar5 = CBS_get_asn1(&local_c0,&local_118,4), sVar3 = local_118.len,
           puVar2 = local_118.data, iVar5 != 0)) {
          pAVar6 = &(local_130._M_head_impl)->signature_spki;
          bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_118.len);
          if (bVar4 && sVar3 != 0) {
            memmove(pAVar6->data_,puVar2,sVar3);
          }
          if ((bVar4) && (iVar5 = CBS_get_asn1(&local_c0,&local_128,4), iVar5 != 0)) {
            __src = (void *)CONCAT62(local_128.data._2_6_,(uint16_t)local_128.data);
            pAVar6 = &(local_130._M_head_impl)->signature;
            bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_128.len);
            if (bVar4 && local_128.len != 0) {
              memmove(pAVar6->data_,__src,local_128.len);
            }
            if (bVar4) {
              (local_130._M_head_impl)->signature_algorithm = local_c8;
              goto LAB_0013fe7a;
            }
          }
        }
      }
      iVar5 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x44a);
      goto LAB_0013ff0e;
    }
LAB_0013fe7a:
    if (local_e4 != 0) {
      pAVar6 = &(local_130._M_head_impl)->decrypted_psk;
      bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_60.len);
      if (bVar4 && local_60.len != 0) {
        memmove(pAVar6->data_,local_60.data,local_60.len);
      }
      if (!bVar4) goto LAB_001402b9;
    }
    if ((local_e4 == 0) || (line = 0x454, (local_130._M_head_impl)->ignore_psk == false)) {
      if (local_d8 != 0) {
        iVar5 = CBS_get_asn1_uint64(&local_a0,(uint64_t *)&local_128);
        if (((iVar5 != 0) &&
            (0xffffffffffff0000 < CONCAT62(local_128.data._2_6_,(uint16_t)local_128.data) - 0x10000U
            )) && (iVar5 = CBS_get_asn1(&local_a0,&local_108,4), sVar3 = local_108.len,
                  puVar2 = local_108.data, iVar5 != 0)) {
          pAVar6 = &(local_130._M_head_impl)->cert_compression_input;
          bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_108.len);
          if (bVar4 && sVar3 != 0) {
            memmove(pAVar6->data_,puVar2,sVar3);
          }
          if ((bVar4) &&
             (iVar5 = CBS_get_asn1(&local_a0,&local_118,4), sVar3 = local_118.len,
             puVar2 = local_118.data, iVar5 != 0)) {
            pAVar6 = &(local_130._M_head_impl)->cert_compression_output;
            bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_118.len);
            if (bVar4 && sVar3 != 0) {
              memmove(pAVar6->data_,puVar2,sVar3);
            }
            if (bVar4) {
              (local_130._M_head_impl)->cert_compression_alg_id = (uint16_t)local_128.data;
              goto LAB_00140091;
            }
          }
        }
        iVar5 = 0;
        ERR_put_error(0x10,0,0x13c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                      ,0x461);
        goto LAB_0013ff0e;
      }
LAB_00140091:
      _Var1._M_head_impl = local_130._M_head_impl;
      if (local_dc != 0) {
        bVar4 = bssl::Array<unsigned_char>::InitUninitialized
                          (&(local_130._M_head_impl)->server_random_tls12,local_70.len);
        if (bVar4 && local_70.len != 0) {
          memmove(((_Var1._M_head_impl)->server_random_tls12).data_,local_70.data,local_70.len);
        }
        if (!bVar4) goto LAB_001402b9;
      }
      if (local_e0 != 0) {
        iVar5 = CBS_get_asn1_uint64(&local_b0,(uint64_t *)&local_128);
        if (((iVar5 != 0) &&
            (0xffffffffffff0000 < CONCAT62(local_128.data._2_6_,(uint16_t)local_128.data) - 0x10000U
            )) && (iVar5 = CBS_get_asn1(&local_b0,&local_108,4), iVar5 != 0)) {
          pAVar6 = &(local_130._M_head_impl)->ecdhe_public_key;
          bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_108.len);
          if (bVar4 && local_108.len != 0) {
            memmove(pAVar6->data_,local_108.data,local_108.len);
          }
          if ((bVar4) && (iVar5 = CBS_get_asn1(&local_b0,&local_118,4), iVar5 != 0)) {
            pAVar6 = &(local_130._M_head_impl)->ecdhe_private_key;
            bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_118.len);
            if (bVar4 && local_118.len != 0) {
              memmove(pAVar6->data_,local_118.data,local_118.len);
            }
            if (bVar4) {
              (local_130._M_head_impl)->ecdhe_group_id = (uint16_t)local_128.data;
              goto LAB_001401ff;
            }
          }
        }
        iVar5 = 0;
        ERR_put_error(0x10,0,0x13c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                      ,0x475);
        goto LAB_0013ff0e;
      }
LAB_001401ff:
      if (local_e8 != 0) {
        pAVar6 = &(local_130._M_head_impl)->decrypted_ticket;
        bVar4 = bssl::Array<unsigned_char>::InitUninitialized(pAVar6,local_80.len);
        if (bVar4 && local_80.len != 0) {
          memmove(pAVar6->data_,local_80.data,local_80.len);
        }
        if (!bVar4) goto LAB_001402b9;
      }
      _Var1._M_head_impl = local_130._M_head_impl;
      if (local_e8 == 0) {
LAB_00140274:
        line = 0x483;
        if ((local_130._M_head_impl)->renew_ticket != true) {
LAB_0014028b:
          local_130._M_head_impl = (pointer)0x0;
          std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)
                     &((ssl->s3->hs)._M_t.
                       super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->hints,
                     _Var1._M_head_impl);
          iVar5 = 1;
          goto LAB_0013ff0e;
        }
      }
      else {
        line = 0x47f;
        if ((local_130._M_head_impl)->ignore_ticket == false) {
          if (local_e8 == 0) goto LAB_00140274;
          goto LAB_0014028b;
        }
      }
    }
  }
  iVar5 = 0;
  ERR_put_error(0x10,0,0x13c,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                ,line);
LAB_0013ff0e:
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)&local_130);
  return iVar5;
}

Assistant:

int SSL_set_handshake_hints(SSL *ssl, const uint8_t *hints, size_t hints_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints_obj == nullptr) {
    return 0;
  }

  CBS cbs, seq, server_random_tls13, key_share, signature_hint, psk,
      cert_compression, server_random_tls12, ecdhe, ticket;
  int has_server_random_tls13, has_key_share, has_signature_hint, has_psk,
      has_cert_compression, has_server_random_tls12, has_ecdhe, has_ticket;
  CBS_init(&cbs, hints, hints_len);
  if (!CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls13,
                             &has_server_random_tls13, kServerRandomTLS13Tag) ||
      !CBS_get_optional_asn1(&seq, &key_share, &has_key_share,
                             kKeyShareHintTag) ||
      !CBS_get_optional_asn1(&seq, &signature_hint, &has_signature_hint,
                             kSignatureHintTag) ||
      !CBS_get_optional_asn1(&seq, &psk, &has_psk, kDecryptedPSKTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_psk,
                                  kIgnorePSKTag) ||
      !CBS_get_optional_asn1(&seq, &cert_compression, &has_cert_compression,
                             kCompressCertificateTag) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls12,
                             &has_server_random_tls12, kServerRandomTLS12Tag) ||
      !CBS_get_optional_asn1(&seq, &ecdhe, &has_ecdhe, kECDHEHintTag) ||
      !CBS_get_optional_asn1(&seq, &ticket, &has_ticket, kDecryptedTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->renew_ticket,
                                  kRenewTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_ticket,
                                  kIgnoreTicketTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_server_random_tls13 &&
      !hints_obj->server_random_tls13.CopyFrom(server_random_tls13)) {
    return 0;
  }

  if (has_key_share) {
    uint64_t group_id;
    CBS ciphertext, secret;
    if (!CBS_get_asn1_uint64(&key_share, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&key_share, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_ciphertext.CopyFrom(ciphertext) ||
        !CBS_get_asn1(&key_share, &secret, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_secret.CopyFrom(secret)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->key_share_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_signature_hint) {
    uint64_t sig_alg;
    CBS input, spki, signature;
    if (!CBS_get_asn1_uint64(&signature_hint, &sig_alg) ||  //
        sig_alg == 0 || sig_alg > 0xffff ||
        !CBS_get_asn1(&signature_hint, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_input.CopyFrom(input) ||
        !CBS_get_asn1(&signature_hint, &spki, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_spki.CopyFrom(spki) ||
        !CBS_get_asn1(&signature_hint, &signature, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature.CopyFrom(signature)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->signature_algorithm = static_cast<uint16_t>(sig_alg);
  }

  if (has_psk && !hints_obj->decrypted_psk.CopyFrom(psk)) {
    return 0;
  }
  if (has_psk && hints_obj->ignore_psk) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_cert_compression) {
    uint64_t alg;
    CBS input, output;
    if (!CBS_get_asn1_uint64(&cert_compression, &alg) ||  //
        alg == 0 || alg > 0xffff ||
        !CBS_get_asn1(&cert_compression, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_input.CopyFrom(input) ||
        !CBS_get_asn1(&cert_compression, &output, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_output.CopyFrom(output)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->cert_compression_alg_id = static_cast<uint16_t>(alg);
  }

  if (has_server_random_tls12 &&
      !hints_obj->server_random_tls12.CopyFrom(server_random_tls12)) {
    return 0;
  }

  if (has_ecdhe) {
    uint64_t group_id;
    CBS public_key, private_key;
    if (!CBS_get_asn1_uint64(&ecdhe, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&ecdhe, &public_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_public_key.CopyFrom(public_key) ||
        !CBS_get_asn1(&ecdhe, &private_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_private_key.CopyFrom(private_key)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->ecdhe_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_ticket && !hints_obj->decrypted_ticket.CopyFrom(ticket)) {
    return 0;
  }
  if (has_ticket && hints_obj->ignore_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }
  if (!has_ticket && hints_obj->renew_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  ssl->s3->hs->hints = std::move(hints_obj);
  return 1;
}